

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O3

void addinfo(lua_State *L,char *msg)

{
  CallInfo *pCVar1;
  long lVar2;
  uint uVar3;
  char buff [60];
  char local_58 [64];
  
  pCVar1 = L->ci;
  if ((pCVar1->callstatus & 1) != 0) {
    lVar2 = *(long *)((pCVar1->func->value_).f + 0x18);
    if (*(long *)(lVar2 + 0x28) == 0) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(uint *)(*(long *)(lVar2 + 0x28) +
                       (((long)(pCVar1->u).l.savedpc - *(long *)(lVar2 + 0x18)) * 0x40000000 +
                        -0x100000000 >> 0x20) * 4);
    }
    if (*(long *)(lVar2 + 0x48) == 0) {
      local_58[0] = '?';
      local_58[1] = '\0';
    }
    else {
      luaO_chunkid(local_58,(char *)(*(long *)(lVar2 + 0x48) + 0x18),0x3c);
    }
    luaO_pushfstring(L,"%s:%d: %s",local_58,(ulong)uVar3,msg);
  }
  return;
}

Assistant:

static void addinfo (lua_State *L, const char *msg) {
  CallInfo *ci = L->ci;
  if (isLua(ci)) {  /* is Lua code? */
    char buff[LUA_IDSIZE];  /* add file:line information */
    int line = currentline(ci);
    TString *src = ci_func(ci)->p->source;
    if (src)
      luaO_chunkid(buff, getstr(src), LUA_IDSIZE);
    else {  /* no source available; use "?" instead */
      buff[0] = '?'; buff[1] = '\0';
    }
    luaO_pushfstring(L, "%s:%d: %s", buff, line, msg);
  }
}